

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef BinaryenDataDrop(BinaryenModuleRef module,char *segment)

{
  DataDrop *pDVar1;
  string_view local_30;
  Builder local_20;
  char *local_18;
  char *segment_local;
  BinaryenModuleRef module_local;
  
  local_18 = segment;
  segment_local = (char *)module;
  wasm::Builder::Builder(&local_20,module);
  wasm::Name::Name((Name *)&local_30,local_18);
  pDVar1 = wasm::Builder::makeDataDrop(&local_20,(Name)local_30);
  return (BinaryenExpressionRef)pDVar1;
}

Assistant:

BinaryenExpressionRef BinaryenDataDrop(BinaryenModuleRef module,
                                       const char* segment) {
  return static_cast<Expression*>(
    Builder(*(Module*)module).makeDataDrop(Name(segment)));
}